

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.h
# Opt level: O1

t_pvalue __thiscall
xemmai::t_enum_of<std::filesystem::perms,_xemmai::t_os>::f_transfer
          (t_enum_of<std::filesystem::perms,_xemmai::t_os> *this,t_os *a_library,perms a_value)

{
  t_heap<xemmai::t_object> *this_00;
  t_type *ptVar1;
  long lVar2;
  t_queue<128UL> *this_01;
  t_queue<256UL> *this_02;
  long *plVar3;
  t_object *ptVar4;
  undefined8 *puVar5;
  t_object *ptVar6;
  char *pcVar7;
  anon_union_8_2_8dc3d723_for_t_value<xemmai::t_pointer>_2 aVar8;
  anon_union_8_2_8dc3d723_for_t_value<xemmai::t_pointer>_2 extraout_RDX;
  size_t sVar9;
  undefined1 auVar10 [16];
  t_pvalue tVar11;
  
  ptVar1 = (a_library->v_type_permissions).v_p;
  plVar3 = (long *)__tls_get_addr(&PTR_0011ed08);
  lVar2 = *plVar3;
  this_00 = (t_heap<xemmai::t_object> *)(lVar2 + 0x30);
  sVar9 = ptVar1->v_instance_fields * 0x10 + 0x50;
  if (sVar9 < 0x81) {
    plVar3 = (long *)__tls_get_addr(&PTR_0011ede0);
    ptVar6 = (t_object *)*plVar3;
    if (ptVar6 == (t_object *)0x0) {
      ptVar6 = t_heap<xemmai::t_object>::t_of<0UL,_65536UL>::f_allocate
                         ((t_of<0UL,_65536UL> *)(lVar2 + 0x90),this_00);
      ptVar4 = ptVar6->v_next;
    }
    else {
      ptVar4 = ptVar6->v_next;
    }
    *plVar3 = (long)ptVar4;
  }
  else {
    ptVar6 = t_heap<xemmai::t_object>::f_allocate_medium(this_00,sVar9);
  }
  ptVar6->v_next = (t_object *)0x0;
  sVar9 = ptVar1->v_instance_fields;
  if (sVar9 != 0) {
    pcVar7 = ptVar6->v_data + 8;
    do {
      pcVar7[0] = '\0';
      pcVar7[1] = '\0';
      pcVar7[2] = '\0';
      pcVar7[3] = '\0';
      pcVar7[4] = '\0';
      pcVar7[5] = '\0';
      pcVar7[6] = '\0';
      pcVar7[7] = '\0';
      pcVar7 = pcVar7 + 0x10;
      sVar9 = sVar9 - 1;
    } while (sVar9 != 0);
  }
  *(ulong *)ptVar6->v_data = (ulong)a_value;
  puVar5 = (undefined8 *)__tls_get_addr(&PTR_0011ece0);
  this_01 = (t_queue<128UL> *)*puVar5;
  *this_01->v_head = (t_object *)&ptVar1[-1].f_less;
  if (this_01->v_head == this_01->v_next) {
    t_slot::t_queue<128UL>::f_next(this_01);
  }
  else {
    this_01->v_head = this_01->v_head + 1;
  }
  ptVar6->v_type = ptVar1;
  auVar10 = __tls_get_addr(&PTR_0011ed30);
  aVar8.v_integer = auVar10._8_8_;
  this_02 = (t_queue<256UL> *)*auVar10._0_8_;
  *this_02->v_head = ptVar6;
  if (this_02->v_head == this_02->v_next) {
    t_slot::t_queue<256UL>::f_next(this_02);
    aVar8 = extraout_RDX;
  }
  else {
    this_02->v_head = this_02->v_head + 1;
  }
  *(t_object **)
   &(this->
    super_t_derivable<xemmai::t_bears<std::filesystem::perms,_xemmai::t_type_of<long>_>,_xemmai::t_derived<xemmai::t_type_of<std::filesystem::perms>_>_>
    ).super_t_bears<std::filesystem::perms,_xemmai::t_type_of<long>_>.
    super_t_derives<std::filesystem::perms,_xemmai::t_type_of<long>_>.super_t_type_of<long>.
    super_t_derivable<xemmai::t_bears<long,_xemmai::t_type_of<xemmai::t_object>_>,_xemmai::t_derived_primitive<long>_>
    .super_t_bears<long,_xemmai::t_type_of<xemmai::t_object>_>.
    super_t_derives<long,_xemmai::t_type_of<xemmai::t_object>_> = ptVar6;
  tVar11.field_0.v_integer = aVar8.v_integer;
  tVar11.super_t_pointer.v_p = (t_object *)this;
  return tVar11;
}

Assistant:

static t_pvalue f_transfer(const T_library* a_library, T a_value)
	{
		return a_library->template f_type<typename t_fundamental<T>::t_type>()->template f_new<intptr_t>(static_cast<intptr_t>(a_value));
	}